

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayQueryFunction::DimResult::DimResult
          (DimResult *this,AssociativeArray *map,Type *indexType)

{
  Type *indexType_local;
  AssociativeArray *map_local;
  DimResult *this_local;
  
  AssociativeArray::AssociativeArray(&this->map,map);
  this->indexType = indexType;
  ConstantRange::ConstantRange(&this->range);
  this->hardFail = false;
  this->isDynamic = false;
  this->outOfRange = false;
  return;
}

Assistant:

DimResult(AssociativeArray&& map, const Type* indexType) :
            map(std::move(map)), indexType(indexType) {}